

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O0

vector<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
* __thiscall polyscope::render::Engine::distantCubeCoords(Engine *this)

{
  vector<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
  *in_RDI;
  anon_class_8_1_5064155c addCubeFace;
  vector<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
  *coords;
  
  std::
  vector<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
  ::vector((vector<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
            *)0x36b535);
  distantCubeCoords::anon_class_8_1_5064155c::operator()
            ((anon_class_8_1_5064155c *)coords,this._4_4_,this._0_4_);
  distantCubeCoords::anon_class_8_1_5064155c::operator()
            ((anon_class_8_1_5064155c *)coords,this._4_4_,this._0_4_);
  distantCubeCoords::anon_class_8_1_5064155c::operator()
            ((anon_class_8_1_5064155c *)coords,this._4_4_,this._0_4_);
  distantCubeCoords::anon_class_8_1_5064155c::operator()
            ((anon_class_8_1_5064155c *)coords,this._4_4_,this._0_4_);
  distantCubeCoords::anon_class_8_1_5064155c::operator()
            ((anon_class_8_1_5064155c *)coords,this._4_4_,this._0_4_);
  distantCubeCoords::anon_class_8_1_5064155c::operator()
            ((anon_class_8_1_5064155c *)coords,this._4_4_,this._0_4_);
  return in_RDI;
}

Assistant:

std::vector<glm::vec4> Engine::distantCubeCoords() {
  std::vector<glm::vec4> coords;

  auto addCubeFace = [&](int iS, float s) {
    int iU = (iS + 1) % 3;
    int iR = (iS + 2) % 3;

    glm::vec4 lowerLeft(0., 0., 0., 0.);
    lowerLeft[iS] = s;
    lowerLeft[iU] = -s;
    lowerLeft[iR] = -s;

    glm::vec4 lowerRight(0., 0., 0., 0.);
    lowerRight[iS] = s;
    lowerRight[iU] = -s;
    lowerRight[iR] = s;

    glm::vec4 upperLeft(0., 0., 0., 0.);
    upperLeft[iS] = s;
    upperLeft[iU] = s;
    upperLeft[iR] = -s;

    glm::vec4 upperRight(0., 0., 0., 0.);
    upperRight[iS] = s;
    upperRight[iU] = s;
    upperRight[iR] = s;

    // first triangle
    coords.push_back(lowerLeft);
    coords.push_back(lowerRight);
    coords.push_back(upperRight);

    // second triangle
    coords.push_back(lowerLeft);
    coords.push_back(upperRight);
    coords.push_back(upperLeft);
  };

  addCubeFace(0, +1.);
  addCubeFace(0, -1.);
  addCubeFace(1, +1.);
  addCubeFace(1, -1.);
  addCubeFace(2, +1.);
  addCubeFace(2, -1.);

  return coords;
}